

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O3

void __thiscall
FastPForLib::FastPForTest_fastpack_zeors_Test::~FastPForTest_fastpack_zeors_Test
          (FastPForTest_fastpack_zeors_Test *this)

{
  pointer plVar1;
  pointer piVar2;
  IntegerCODEC *pIVar3;
  
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__FastPForTest_001b67b8;
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__FastPForTest_001b67f8;
  plVar1 = (this->super_FastPForTest).out64.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)(this->super_FastPForTest).out64.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar1);
  }
  piVar2 = (this->super_FastPForTest).out32.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_FastPForTest).out32.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  plVar1 = (this->super_FastPForTest).in64.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)(this->super_FastPForTest).in64.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar1);
  }
  piVar2 = (this->super_FastPForTest).in32.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_FastPForTest).in32.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  pIVar3 = (this->super_FastPForTest).codec._M_t.
           super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
           ._M_t.
           super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
           .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl;
  if (pIVar3 != (IntegerCODEC *)0x0) {
    (*pIVar3->_vptr_IntegerCODEC[5])();
  }
  (this->super_FastPForTest).codec._M_t.
  super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>.
  _M_t.
  super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
  .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl = (IntegerCODEC *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_zeors) {
    in32.clear();
    for (int i = 0; i < 256; ++i) {
      in32.push_back(0);
    }
    _verify();
    _copy64();
    _verify64();
  }